

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
assembler::anon_unknown_0::_get_arguments
          (vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
           *__return_storage_ptr__,external_function *f)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t i_1;
  size_t i;
  ulong uVar6;
  value_type reg;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> arg_regs;
  operand local_4c;
  _Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> local_48;
  
  if ((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_reg == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 _get_arguments(assembler::external_function_const&)::arg_reg);
    if (iVar4 != 0) {
      _get_arguments::arg_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _get_arguments::arg_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _get_arguments::arg_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x11;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,0x12);
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_reg,(operand *)&local_48);
      __cxa_atexit(std::
                   vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                   ::~vector,&_get_arguments::arg_reg,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           _get_arguments(assembler::external_function_const&)::arg_reg);
    }
  }
  if ((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_float_reg ==
      '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 _get_arguments(assembler::external_function_const&)::arg_float_reg)
    ;
    if (iVar4 != 0) {
      _get_arguments::arg_float_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _get_arguments::arg_float_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _get_arguments::arg_float_reg.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x43;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x44;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x45;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x46;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x47;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,0x48);
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      emplace_back<assembler::asmcode::operand>(&_get_arguments::arg_float_reg,(operand *)&local_48)
      ;
      __cxa_atexit(std::
                   vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                   ::~vector,&_get_arguments::arg_float_reg,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           _get_arguments(assembler::external_function_const&)::arg_float_reg);
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = 0;
  iVar4 = 0;
  uVar6 = 0;
  while( true ) {
    lVar2 = *(long *)&f->arguments;
    lVar3 = *(long *)&f->field_0x30;
    if ((ulong)(lVar3 - lVar2 >> 2) <= uVar6) break;
    if (*(int *)(lVar2 + uVar6 * 4) == 2) {
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
                )&local_48,
                _get_arguments::arg_float_reg.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar4);
      iVar4 = iVar4 + 1;
    }
    else {
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
                )&local_48,
                _get_arguments::arg_reg.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar5);
      iVar5 = iVar5 + 1;
    }
    uVar6 = uVar6 + 1;
  }
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0;
  do {
    if ((ulong)(lVar3 - lVar2 >> 2) <= uVar6) {
      std::_Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      ~_Vector_base(&local_48);
      return __return_storage_ptr__;
    }
    uVar1 = *(uint *)(lVar2 + uVar6 * 4);
    if (uVar1 < 2) {
LAB_0011ecfb:
      local_4c = local_48._M_impl.super__Vector_impl_data._M_start[uVar6];
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back(__return_storage_ptr__,&local_4c);
    }
    else if (uVar1 == 2) {
      local_4c = local_48._M_impl.super__Vector_impl_data._M_start[uVar6];
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back(__return_storage_ptr__,&local_4c);
    }
    else if (uVar1 == 3) goto LAB_0011ecfb;
    uVar6 = uVar6 + 1;
    lVar2 = *(long *)&f->arguments;
    lVar3 = *(long *)&f->field_0x30;
  } while( true );
}

Assistant:

std::vector<asmcode::operand> _get_arguments(const external_function& f)
    {
#ifdef _WIN32
    static std::vector<asmcode::operand> arg_reg = get_windows_calling_registers();
#else
    static std::vector<asmcode::operand> arg_reg = get_linux_calling_registers();
#endif
    static std::vector<asmcode::operand> arg_float_reg = get_floating_point_registers();
#ifndef _WIN32
    std::vector<asmcode::operand> arg_regs;
    int regular_arg_id = 0;
    int floating_arg_id = 0;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      if (f.arguments[i] == external_function::T_DOUBLE)
        {
        arg_regs.push_back(arg_float_reg[floating_arg_id]);
        ++floating_arg_id;
        }
      else
        {
        arg_regs.push_back(arg_reg[regular_arg_id]);
        ++regular_arg_id;
        }
      }
#endif

    std::vector<asmcode::operand> args;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      switch (f.arguments[i])
        {
        case external_function::T_CHAR_POINTER:
        case external_function::T_INT64:
        case external_function::T_BOOL:
        {
#ifdef _WIN32
        auto reg = arg_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        case external_function::T_DOUBLE:
        {
#ifdef _WIN32
        auto reg = arg_float_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        }
      }
    return args;
    }